

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_getlastmodtime(char *args)

{
  int iVar1;
  undefined8 uVar2;
  size_t strsize;
  PHYSFS_Stat statbuf;
  char modstr [64];
  undefined1 local_70 [8];
  PHYSFS_sint64 local_68;
  char local_48 [64];
  
  iVar1 = PHYSFS_stat(args,local_70);
  if (iVar1 == 0) {
    uVar2 = PHYSFS_getLastError();
    printf("Failed to determine. Reason: [%s].\n",uVar2);
  }
  else {
    modTimeToStr(local_68,local_48,strsize);
    printf("Last modified: %s (%ld).\n",local_48,local_68);
  }
  return 1;
}

Assistant:

static int cmd_getlastmodtime(char *args)
{
    PHYSFS_Stat statbuf;
    if (!PHYSFS_stat(args, &statbuf))
        printf("Failed to determine. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        char modstr[64];
        modTimeToStr(statbuf.modtime, modstr, sizeof (modstr));
        printf("Last modified: %s (%ld).\n", modstr, (long) statbuf.modtime);
    } /* else */

    return 1;
}